

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint uivector_resize(uivector *p,size_t size)

{
  size_t new_size;
  uint *puVar1;
  void *data;
  size_t newsize;
  size_t allocsize;
  size_t size_local;
  uivector *p_local;
  
  if (p->allocsize < size * 4) {
    new_size = size * 4 + (p->allocsize >> 1);
    puVar1 = (uint *)lodepng_realloc(p->data,new_size);
    if (puVar1 == (uint *)0x0) {
      return 0;
    }
    p->allocsize = new_size;
    p->data = puVar1;
  }
  p->size = size;
  return 1;
}

Assistant:

static unsigned uivector_resize(uivector* p, size_t size) {
  size_t allocsize = size * sizeof(unsigned);
  if(allocsize > p->allocsize) {
    size_t newsize = allocsize + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if(data) {
      p->allocsize = newsize;
      p->data = (unsigned*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  p->size = size;
  return 1; /*success*/
}